

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O2

int Js::JavascriptString::LastIndexOfUsingJmpTable
              (Boyer_Moore_Jump *jmpTable,char16 *inputStr,charcount_t len,char16 *searchStr,
              charcount_t searchLen,charcount_t position)

{
  char16 cVar1;
  char16 cVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  char16 *string1;
  undefined4 *local_48;
  
  if (searchLen == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *local_48 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xda8,"(searchLen > 0)","searchLen > 0");
    if (!bVar4) {
LAB_00bbd614:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *local_48 = 0;
  }
  else {
    local_48 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  cVar1 = *searchStr;
  uVar5 = jmpTable[(ushort)cVar1].shift;
  if (jmpTable[(ushort)cVar1].shift == 0) {
    uVar5 = searchLen;
  }
  uVar9 = len - searchLen;
  if (position <= len - searchLen) {
    uVar9 = position;
  }
  string1 = inputStr + uVar9;
  do {
    uVar9 = (uint)((ulong)((long)string1 - (long)inputStr) >> 1);
    cVar2 = *string1;
    if (cVar2 == cVar1) {
      iVar6 = PAL_wmemcmp(string1,searchStr,(ulong)searchLen);
      uVar8 = uVar5;
      if (iVar6 == 0) {
        return uVar9;
      }
LAB_00bbd59e:
      uVar7 = uVar8;
      if (uVar8 != 0) goto LAB_00bbd5a4;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *local_48 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xdcb,"(backwardOffset > 0)","backwardOffset > 0");
      if (!bVar4) goto LAB_00bbd614;
      *local_48 = 0;
      uVar7 = 0;
    }
    else {
      uVar8 = searchLen;
      if ((0x7f < (ushort)cVar2) || (uVar7 = jmpTable[(ushort)cVar2].shift, uVar7 == 0))
      goto LAB_00bbd59e;
LAB_00bbd5a4:
      if (uVar9 < uVar7) {
        return -1;
      }
    }
    string1 = string1 + -(ulong)uVar7;
  } while( true );
}

Assistant:

int JavascriptString::LastIndexOfUsingJmpTable(JmpTable jmpTable, const char16* inputStr, charcount_t len, const char16* searchStr, charcount_t searchLen, charcount_t position)
    {
        Assert(searchLen > 0);
        const char16 searchFirst = searchStr[0];
        uint32 lMatchedJump = searchLen;
        if (jmpTable[searchFirst].shift > 0)
        {
            lMatchedJump = jmpTable[searchFirst].shift;
        }
        WCHAR c;
        char16 const * p = inputStr + min(len - searchLen, position);

        while (true)
        {
            uint32 remaining = (uint32)(p - inputStr);
            uint32 backwardOffset = 0;
            // first character match, keep checking
            if (*p == searchFirst)
            {
                if (wmemcmp(p, searchStr, searchLen) == 0)
                {
                    return (int)remaining;
                }
                backwardOffset = lMatchedJump;
            }
            else
            {
                c = *p;
                if (0 == (c & ~0x7f) && jmpTable[c].shift != 0)
                {
                    backwardOffset = jmpTable[c].shift;
                }
                else
                {
                    backwardOffset = searchLen;
                }
            }
            AssertOrFailFast(backwardOffset > 0);
            if (backwardOffset > remaining)
            {
                break;
            }
            p -= backwardOffset;
        }

        return -1;
    }